

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O2

void __thiscall
crnlib::dxt_hc::determine_color_endpoint_codebook_task(dxt_hc *this,uint64 data,void *param_2)

{
  uchar uVar1;
  byte bVar2;
  uint uVar3;
  uint uVar4;
  color_cluster *pcVar5;
  undefined1 auVar6 [14];
  undefined1 auVar7 [14];
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  byte bVar12;
  uint i;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  uint p;
  uint8 t;
  color_cluster *pcVar17;
  long lVar18;
  undefined1 auVar19 [16];
  color_quad_u8 color_values [4];
  vector<unsigned_char> selectors;
  color_quad_u8 block_values [4];
  params local_ab8;
  color_cluster *local_a90;
  ulong local_a88;
  ulong local_a80;
  ulong local_a78;
  results results;
  params local_a50;
  results refinerResults;
  dxt_endpoint_refiner refiner;
  float encoding_weight [8];
  dxt1_endpoint_optimizer optimizer;
  
  uVar3 = this->m_pTask_pool->m_num_threads;
  dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(&optimizer);
  dxt_endpoint_refiner::dxt_endpoint_refiner(&refiner);
  selectors.m_p = (uchar *)0x0;
  selectors.m_size = 0;
  selectors.m_capacity = 0;
  while (uVar16 = (uint)data, uVar16 < (this->m_color_clusters).m_size) {
    uVar15 = data & 0xffffffff;
    pcVar5 = (this->m_color_clusters).m_p;
    uVar9 = pcVar5[uVar15].pixels.m_size;
    if (uVar9 != 0) {
      local_ab8.m_dxt1a_alpha_threshold = 0x80;
      local_ab8.m_grayscale_sampling = false;
      local_ab8.m_use_transparent_indices_for_black = false;
      local_ab8.m_force_alpha_blocks = false;
      pcVar17 = pcVar5 + uVar15;
      local_ab8.m_pPixels = (pcVar17->pixels).m_p;
      local_ab8.m_pixels_have_alpha = false;
      local_ab8.m_use_alpha_blocks = false;
      local_ab8.m_perceptual = (this->m_params).m_perceptual;
      local_ab8.m_quality = cCRNDXTQualityUber;
      local_ab8.m_endpoint_caching = false;
      results.m_pSelectors = (uint8 *)0x0;
      local_ab8.m_block_index = uVar16;
      local_ab8.m_num_pixels = uVar9;
      vector<unsigned_char>::resize(&selectors,uVar9,false);
      results.m_pSelectors = selectors.m_p;
      dxt1_endpoint_optimizer::compute(&optimizer,&local_ab8,&results);
      pcVar17->first_endpoint = (uint)results.m_low_color;
      pcVar17->second_endpoint = (uint)results.m_high_color;
      dxt1_block::get_block_colors4(block_values,results.m_low_color,results.m_high_color);
      for (lVar14 = 0; lVar14 != 4; lVar14 = lVar14 + 1) {
        bVar12 = (&g_dxt1_from_linear)[lVar14];
        uVar1 = block_values[bVar12].field_0.field_0.r;
        pcVar5[uVar15].color_values[lVar14].field_0.field_0.r = uVar1;
        pcVar5[uVar15].color_values[lVar14].field_0.field_0.g =
             block_values[bVar12].field_0.field_0.g;
        pcVar5[uVar15].color_values[lVar14].field_0.field_0.b =
             block_values[bVar12].field_0.field_0.b;
        pcVar5[uVar15].color_values[lVar14].field_0.field_0.a =
             block_values[bVar12].field_0.field_0.a;
        color_values[lVar14].field_0.field_0.r = uVar1;
        color_values[lVar14].field_0.field_0.g =
             pcVar5[uVar15].color_values[lVar14].field_0.field_0.g;
        color_values[lVar14].field_0.field_0.b =
             pcVar5[uVar15].color_values[lVar14].field_0.field_0.b;
        color_values[lVar14].field_0.field_0.a =
             pcVar5[uVar15].color_values[lVar14].field_0.field_0.a;
      }
      if (results.m_alternate_rounding == true) {
        for (lVar14 = -3; lVar14 != 0; lVar14 = lVar14 + 1) {
          bVar12 = color_values[0].field_0.c[lVar14 + 3];
          bVar2 = color_values[3].field_0.c[lVar14 + 3];
          color_values[1].field_0.c[lVar14 + 3] = (uchar)(((uint)bVar2 + (uint)bVar12 * 2 + 1) / 3);
          color_values[2].field_0.c[lVar14 + 3] = (uchar)(((uint)bVar12 + (uint)bVar2 * 2 + 1) / 3);
        }
      }
      uVar9 = crnlib::color::color_distance
                        ((this->m_params).m_perceptual,color_values,color_values + 3,false);
      for (lVar14 = 0; lVar14 != 8; lVar14 = lVar14 + 1) {
        encoding_weight[lVar14] = ((float)(int)lVar14 / 7.0) * -0.14999998 + 1.15;
      }
      local_a90 = pcVar17;
      uVar15 = 0;
      while (pcVar5 = local_a90, uVar15 < local_a90->blocks[0].m_size) {
        local_a80 = uVar15;
        uVar4 = local_a90->blocks[0].m_p[uVar15];
        uVar10 = (uint)(long)((this->m_block_weights).m_p[uVar4] * (float)(uVar9 / 2000));
        uVar13 = 0x800;
        if (uVar10 < 0x800) {
          uVar13 = uVar10;
        }
        if (uVar10 == 0) {
          uVar13 = 1;
        }
        local_a88 = (long)((float)(int)uVar13 *
                          encoding_weight[(this->m_block_encodings).m_p[uVar4]]);
        uVar15 = 0;
        for (lVar14 = 0; lVar14 != 0x10; lVar14 = lVar14 + 1) {
          local_a78 = uVar15;
          uVar13 = 0xffffffff;
          uVar15 = 0;
          for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
            bVar12 = 3 - (&g_dxt1_to_linear)[lVar18];
            if (results.m_reordered == false) {
              bVar12 = (&g_dxt1_to_linear)[lVar18];
            }
            uVar11 = crnlib::color::color_distance
                               ((this->m_params).m_perceptual,this->m_blocks[uVar4] + lVar14,
                                color_values + bVar12,false);
            if (uVar11 < uVar13) {
              uVar15 = (ulong)bVar12;
              uVar13 = uVar11;
            }
          }
          uVar15 = (ulong)((int)local_a78 << 2 | (uint)uVar15);
        }
        this->m_block_selectors[0].m_p[uVar4] = local_a88 & 0xffffffff | uVar15 << 0x20;
        uVar15 = local_a80 + 1;
      }
      local_a50.m_alpha_comp_index = 0;
      local_a50.m_highest_quality = true;
      local_a50.m_perceptual = (this->m_params).m_perceptual;
      local_a50.m_pSelectors = selectors.m_p;
      local_a50.m_pPixels = (local_a90->pixels).m_p;
      local_a50.m_num_pixels = (local_a90->pixels).m_size;
      local_a50.m_dxt1_selectors = true;
      local_a50.m_error_to_beat = results.m_error;
      local_a50.m_block_index = uVar16;
      bVar8 = dxt_endpoint_refiner::refine(&refiner,&local_a50,&refinerResults);
      if (bVar8) {
        auVar6._8_4_ = 0;
        auVar6._0_2_ = refinerResults.m_low_color;
        auVar6._2_2_ = refinerResults.m_high_color;
        auVar6._4_4_ = refinerResults._4_4_;
        auVar6._12_2_ = refinerResults._6_2_;
        auVar7._8_2_ = refinerResults._4_2_;
        auVar7._0_2_ = refinerResults.m_low_color;
        auVar7._2_2_ = refinerResults.m_high_color;
        auVar7._4_4_ = refinerResults._4_4_;
        auVar7._10_4_ = auVar6._10_4_;
        auVar19._6_10_ = SUB1610(ZEXT616(auVar7._8_6_) << 0x40,6);
        auVar19._4_2_ = refinerResults.m_high_color;
        auVar19._0_2_ = refinerResults.m_low_color;
        auVar19._2_2_ = 0;
        pcVar5->first_endpoint = (int)auVar19._0_8_;
        pcVar5->second_endpoint = (int)((ulong)auVar19._0_8_ >> 0x20);
      }
    }
    data = (uint64)(uVar16 + uVar3 + 1);
  }
  vector<unsigned_char>::~vector(&selectors);
  dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer(&optimizer);
  return;
}

Assistant:

void dxt_hc::determine_color_endpoint_codebook_task(uint64 data, void*)
    {
        const uint num_tasks = m_pTask_pool->get_num_threads() + 1;
        dxt1_endpoint_optimizer optimizer;
        dxt_endpoint_refiner refiner;
        crnlib::vector<uint8> selectors;

        for (uint cluster_index = (uint)data; cluster_index < m_color_clusters.size(); cluster_index += num_tasks)
        {
            color_cluster& cluster = m_color_clusters[cluster_index];
            if (cluster.pixels.empty())
            {
                continue;
            }

            dxt1_endpoint_optimizer::params params;
            params.m_block_index = cluster_index;
            params.m_pPixels = cluster.pixels.get_ptr();
            params.m_num_pixels = cluster.pixels.size();
            params.m_pixels_have_alpha = false;
            params.m_use_alpha_blocks = false;
            params.m_perceptual = m_params.m_perceptual;
            params.m_quality = cCRNDXTQualityUber;
            params.m_endpoint_caching = false;

            dxt1_endpoint_optimizer::results results;
            selectors.resize(params.m_num_pixels);
            results.m_pSelectors = selectors.get_ptr();

            optimizer.compute(params, results);
            cluster.first_endpoint = results.m_low_color;
            cluster.second_endpoint = results.m_high_color;
            color_quad_u8 block_values[4], color_values[4];
            dxt1_block::get_block_colors4(block_values, cluster.first_endpoint, cluster.second_endpoint);
            for (uint i = 0; i < 4; i++)
            {
                color_values[i] = cluster.color_values[i] = block_values[g_dxt1_from_linear[i]];
            }
            for (uint c = 0; results.m_alternate_rounding && c < 3; c++)
            {
                color_values[1].c[c] = ((color_values[0].c[c] << 1) + color_values[3].c[c] + 1) / 3;
                color_values[2].c[c] = ((color_values[3].c[c] << 1) + color_values[0].c[c] + 1) / 3;
            }

            uint endpoint_weight = color::color_distance(m_params.m_perceptual, color_values[0], color_values[3], false) / 2000;
            float encoding_weight[8];
            for (uint i = 0; i < 8; i++)
            {
                encoding_weight[i] = math::lerp(1.15f, 1.0f, i / 7.0f);
            }

            crnlib::vector<uint>& blocks = cluster.blocks[cColor];
            for (uint i = 0; i < blocks.size(); i++)
            {
                uint b = blocks[i];
                uint weight = (uint)(math::clamp<uint>(endpoint_weight * m_block_weights[b], 1, 2048) * encoding_weight[m_block_encodings[b]]);
                uint32 selector = 0;
                for (uint p = 0; p < 16; p++)
                {
                    uint error_best = cUINT32_MAX;
                    uint8 s_best = 0;
                    for (uint8 t = 0; t < 4; t++)
                    {
                        uint8 s = results.m_reordered ? 3 - g_dxt1_to_linear[t] : g_dxt1_to_linear[t];
                        uint error = color::color_distance(m_params.m_perceptual, (color_quad_u8&)m_blocks[b][p], color_values[s], false);
                        if (error < error_best)
                        {
                            s_best = s;
                            error_best = error;
                        }
                    }
                    selector = selector << 2 | s_best;
                }
                m_block_selectors[cColor][b] = (uint64)selector << 32 | weight;
            }

            dxt_endpoint_refiner::params refinerParams;
            dxt_endpoint_refiner::results refinerResults;
            refinerParams.m_perceptual = m_params.m_perceptual;
            refinerParams.m_pSelectors = selectors.get_ptr();
            refinerParams.m_pPixels = cluster.pixels.get_ptr();
            refinerParams.m_num_pixels = cluster.pixels.size();
            refinerParams.m_dxt1_selectors = true;
            refinerParams.m_error_to_beat = results.m_error;
            refinerParams.m_block_index = cluster_index;
            if (refiner.refine(refinerParams, refinerResults))
            {
                cluster.first_endpoint = refinerResults.m_low_color;
                cluster.second_endpoint = refinerResults.m_high_color;
            }
        }
    }